

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.cpp
# Opt level: O1

void __thiscall embree::GridMesh::commit(GridMesh *this)

{
  BufferView<embree::Vec3fa> *pBVar1;
  uint uVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  uVar2 = (this->super_Geometry).numTimeSteps;
  if (uVar2 != 0) {
    pBVar1 = (this->vertices).items;
    psVar4 = &(pBVar1->super_RawBufferView).stride;
    do {
      if ((int)*psVar4 != (int)(pBVar1->super_RawBufferView).stride) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_40 = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "stride of vertex buffers have to be identical for each time step","");
        *puVar3 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar3 + 1) = 3;
        puVar3[2] = puVar3 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar3 + 2),local_40,local_40 + local_38);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      psVar4 = psVar4 + 7;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  Geometry::commit(&this->super_Geometry);
  return;
}

Assistant:

void GridMesh::commit()
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t=0; t<numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of vertex buffers have to be identical for each time step");
      if (vertices[t]) vertices[t].buffer->commitIfNeeded();
    }
    if (grids) grids.buffer->commitIfNeeded();
#if defined(EMBREE_SYCL_SUPPORT)
    
    /* build quadID_to_primID_xy mapping when hardware ray tracing is supported */
    DeviceGPU* gpu_device = dynamic_cast<DeviceGPU*>(device);
    if (gpu_device)
    {
      const size_t numQuads = getNumTotalQuads();
      quadID_to_primID_xy.resize(numQuads);
      
      for (uint32_t primID=0, quadID=0; primID<size(); primID++)
      {
        const Grid& g = grid(primID);
        for (ssize_t y=0; y<ssize_t(g.resY)-1; y++)
          for (ssize_t x=0; x<ssize_t(g.resX)-1; x++)
            quadID_to_primID_xy[quadID++] = { primID, (uint16_t) x, (uint16_t) y };
      }
    }

#endif
    
    Geometry::commit();
  }